

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFindPackageCommand::SetVersionVariables
          (cmFindPackageCommand *this,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
          *addDefinition,string *prefix,string *version,uint count,uint major,uint minor,uint patch,
          uint tweak)

{
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  char local_88 [8];
  char buf [64];
  uint major_local;
  uint count_local;
  string *version_local;
  string *prefix_local;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *addDefinition_local;
  cmFindPackageCommand *this_local;
  
  __args_1 = (basic_string_view<char,_std::char_traits<char>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)version);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(addDefinition,prefix,__args_1);
  snprintf(local_88,0x40,"%u",(ulong)major);
  std::operator+(&local_a8,prefix,"_MAJOR");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,local_88);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(addDefinition,&local_a8,local_b8);
  std::__cxx11::string::~string((string *)&local_a8);
  snprintf(local_88,0x40,"%u",(ulong)minor);
  std::operator+(&local_e8,prefix,"_MINOR");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8,local_88);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(addDefinition,&local_e8,local_f8);
  std::__cxx11::string::~string((string *)&local_e8);
  snprintf(local_88,0x40,"%u",(ulong)patch);
  std::operator+(&local_118,prefix,"_PATCH");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,local_88);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(addDefinition,&local_118,local_128);
  std::__cxx11::string::~string((string *)&local_118);
  snprintf(local_88,0x40,"%u",(ulong)tweak);
  std::operator+(&local_148,prefix,"_TWEAK");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_158,local_88);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(addDefinition,&local_148,local_158);
  std::__cxx11::string::~string((string *)&local_148);
  snprintf(local_88,0x40,"%u",(ulong)count);
  std::operator+(&local_178,prefix,"_COUNT");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,local_88);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(addDefinition,&local_178,local_188);
  std::__cxx11::string::~string((string *)&local_178);
  return;
}

Assistant:

void cmFindPackageCommand::SetVersionVariables(
  const std::function<void(const std::string&, cm::string_view)>&
    addDefinition,
  const std::string& prefix, const std::string& version,
  const unsigned int count, const unsigned int major, const unsigned int minor,
  const unsigned int patch, const unsigned int tweak)
{
  addDefinition(prefix, version);

  char buf[64];
  snprintf(buf, sizeof(buf), "%u", major);
  addDefinition(prefix + "_MAJOR", buf);
  snprintf(buf, sizeof(buf), "%u", minor);
  addDefinition(prefix + "_MINOR", buf);
  snprintf(buf, sizeof(buf), "%u", patch);
  addDefinition(prefix + "_PATCH", buf);
  snprintf(buf, sizeof(buf), "%u", tweak);
  addDefinition(prefix + "_TWEAK", buf);
  snprintf(buf, sizeof(buf), "%u", count);
  addDefinition(prefix + "_COUNT", buf);
}